

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareProgram
          (GPUShaderFP64Test10 *this,functionObject *function_object,programInfo *out_program_info)

{
  GLuint n_varying_names;
  
  n_varying_names = (*function_object->_vptr_functionObject[5])(function_object);
  if (prepareProgram(gl4cts::GPUShaderFP64Test10::functionObject_const&,gl4cts::Utils::programInfo&)
      ::varying_names == '\0') {
    prepareProgram();
  }
  prepareVertexShaderCode(this,function_object);
  Utils::programInfo::build
            (out_program_info,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
             (this->m_vertex_shader_code)._M_dataplus._M_p,prepareProgram::varying_names,
             n_varying_names);
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareProgram(const functionObject& function_object, Utils::programInfo& out_program_info)
{
	const glw::GLuint		  n_varying_names  = function_object.getResultCount();
	static const glw::GLchar* varying_names[3] = { getVaryingName(0), getVaryingName(1), getVaryingName(2) };

	prepareVertexShaderCode(function_object);

	out_program_info.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* tes */, m_vertex_shader_code.c_str(),
						   varying_names, n_varying_names);
}